

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmExtractCallback(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  sxu32 nLen;
  jx9_vm *pVm_00;
  undefined1 local_58 [8];
  SyString sVar;
  jx9_value *pObj;
  jx9_vm *pVm;
  int iFlags;
  extract_aux_data *pAux;
  void *pUserData_local;
  jx9_value *pValue_local;
  jx9_value *pKey_local;
  
  pVm._4_4_ = *(uint *)((long)pUserData + 0x1c);
  pVm_00 = *pUserData;
  if (((pVm._4_4_ & 0x10) != 0) && ((pKey->iFlags & 0xeU) != 0)) {
    pVm._4_4_ = pVm._4_4_ | 8;
  }
  jx9MemObjToString(pKey);
  if ((pKey->sBlob).nByte != 0) {
    sVar.zString._0_4_ = 0;
    if (((pVm._4_4_ & 8) == 0) || (*(int *)((long)pUserData + 0x18) < 1)) {
      if ((pKey->sBlob).nByte < 0x400) {
        nLen = (pKey->sBlob).nByte;
      }
      else {
        nLen = 0x400;
      }
      sVar.zString._0_4_ = SyMemcpy((pKey->sBlob).pBlob,(void *)((long)pUserData + 0x20),nLen);
    }
    else {
      sVar.zString._0_4_ =
           SyBufferFormat((char *)((long)pUserData + 0x20),0x400,"%.*s_%.*s",
                          (ulong)*(uint *)((long)pUserData + 0x18),
                          *(undefined8 *)((long)pUserData + 0x10),(ulong)(pKey->sBlob).nByte,
                          (pKey->sBlob).pBlob);
    }
    local_58 = (undefined1  [8])((long)pUserData + 0x20);
    sVar._8_8_ = VmExtractMemObj(pVm_00,(SyString *)local_58,1,0);
    if ((jx9_value *)sVar._8_8_ == (jx9_value *)0x0) {
      sVar._8_8_ = VmExtractMemObj(pVm_00,(SyString *)local_58,1,1);
    }
    else {
      if ((pVm._4_4_ & 2) != 0) {
        return 0;
      }
      if ((pVm._4_4_ & 4) != 0) {
        if ((pVm._4_4_ & 8) != 0) {
          return 0;
        }
        if (*(int *)((long)pUserData + 0x18) < 1) {
          return 0;
        }
        sVar.zString._0_4_ =
             SyBufferFormat((char *)((long)pUserData + 0x20),0x400,"%.*s_%.*s",
                            (ulong)*(uint *)((long)pUserData + 0x18),
                            *(undefined8 *)((long)pUserData + 0x10),(ulong)(pKey->sBlob).nByte,
                            (pKey->sBlob).pBlob);
        sVar._8_8_ = VmExtractMemObj(pVm_00,(SyString *)local_58,1,1);
      }
    }
    if (sVar._8_8_ != 0) {
      jx9MemObjStore(pValue,(jx9_value *)sVar._8_8_);
      *(int *)((long)pUserData + 8) = *(int *)((long)pUserData + 8) + 1;
    }
  }
  return 0;
}

Assistant:

static int VmExtractCallback(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	extract_aux_data *pAux = (extract_aux_data *)pUserData;
	int iFlags = pAux->iFlags;
	jx9_vm *pVm = pAux->pVm;
	jx9_value *pObj;
	SyString sVar;
	if( (iFlags & 0x10/* EXTR_PREFIX_INVALID */) && (pKey->iFlags & (MEMOBJ_INT|MEMOBJ_BOOL|MEMOBJ_REAL))){
		iFlags |= 0x08; /*EXTR_PREFIX_ALL*/
	}
	/* Perform a string cast */
	jx9MemObjToString(pKey);
	if( SyBlobLength(&pKey->sBlob) < 1 ){
		/* Unavailable variable name */
		return SXRET_OK;
	}
	sVar.nByte = 0; /* cc warning */
	if( (iFlags & 0x08/*EXTR_PREFIX_ALL*/ ) && pAux->Prefixlen > 0 ){
		sVar.nByte = (sxu32)SyBufferFormat(pAux->zWorker, sizeof(pAux->zWorker), "%.*s_%.*s", 
			pAux->Prefixlen, pAux->zPrefix, 
			SyBlobLength(&pKey->sBlob), SyBlobData(&pKey->sBlob)
			);
	}else{
		sVar.nByte = (sxu32) SyMemcpy(SyBlobData(&pKey->sBlob), pAux->zWorker, 
			SXMIN(SyBlobLength(&pKey->sBlob), sizeof(pAux->zWorker)));
	}
	sVar.zString = pAux->zWorker;
	/* Try to extract the variable */
	pObj = VmExtractMemObj(pVm, &sVar, TRUE, FALSE);
	if( pObj ){
		/* Collision */
		if( iFlags & 0x02 /* EXTR_SKIP */ ){
			return SXRET_OK;
		}
		if( iFlags & 0x04 /* EXTR_PREFIX_SAME */ ){
			if( (iFlags & 0x08/*EXTR_PREFIX_ALL*/) || pAux->Prefixlen < 1){
				/* Already prefixed */
				return SXRET_OK;
			}
			sVar.nByte = SyBufferFormat(
				pAux->zWorker, sizeof(pAux->zWorker),
				"%.*s_%.*s", 
				pAux->Prefixlen, pAux->zPrefix, 
				SyBlobLength(&pKey->sBlob), SyBlobData(&pKey->sBlob)
				);
			pObj = VmExtractMemObj(pVm, &sVar, TRUE, TRUE);
		}
	}else{
		/* Create the variable */
		pObj = VmExtractMemObj(pVm, &sVar, TRUE, TRUE);
	}
	if( pObj ){
		/* Overwrite the old value */
		jx9MemObjStore(pValue, pObj);
		/* Increment counter */
		pAux->iCount++;
	}
	return SXRET_OK;
}